

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

void __thiscall
eastl::basic_string<char,_eastl::allocator>::AllocateSelf
          (basic_string<char,_eastl::allocator> *this,size_type n)

{
  value_type *pvVar1;
  size_type n_local;
  basic_string<char,_eastl::allocator> *this_local;
  
  if (n < 2) {
    AllocateSelf(this);
  }
  else {
    pvVar1 = DoAllocate(this,n);
    this->mpBegin = pvVar1;
    this->mpEnd = this->mpBegin;
    this->mpCapacity = this->mpBegin + n;
  }
  return;
}

Assistant:

void basic_string<T, Allocator>::AllocateSelf(size_type n)
    {
        #if EASTL_ASSERT_ENABLED
            if(EASTL_UNLIKELY(n >= 0x40000000))
                EASTL_FAIL_MSG("basic_string::AllocateSelf -- improbably large request.");
        #endif

        #if EASTL_STRING_OPT_LENGTH_ERRORS
            if(EASTL_UNLIKELY(n > kMaxSize))
                ThrowLengthException();
        #endif

        if(n > 1)
        {
            mpBegin    = DoAllocate(n);
            mpEnd      = mpBegin;
            mpCapacity = mpBegin + n;
        }
        else
            AllocateSelf();
    }